

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fputc.c
# Opt level: O0

int fputc(int __c,FILE *__stream)

{
  char *pcVar1;
  int iVar2;
  int local_1c;
  _PDCLIB_file_t *stream_local;
  int c_local;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar2 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__stream);
  if (iVar2 == -1) {
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    stream_local._4_4_ = -1;
  }
  else {
    pcVar1 = __stream->_IO_read_base;
    __stream->_IO_read_base = pcVar1 + 1;
    __stream->_IO_read_ptr[(long)pcVar1] = (char)__c;
    if ((__stream->_IO_read_base == __stream->_IO_read_end) ||
       (((((ulong)__stream->_IO_buf_end & 0x200000000) != 0 && ((char)__c == '\n')) ||
        (stream_local._0_4_ = __c, ((ulong)__stream->_IO_buf_end & 0x400000000) != 0)))) {
      iVar2 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
      local_1c = __c;
      if (iVar2 != 0) {
        local_1c = -1;
      }
      stream_local._0_4_ = local_1c;
    }
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    stream_local._4_4_ = (int)stream_local;
  }
  return stream_local._4_4_;
}

Assistant:

int fputc( int c, struct _PDCLIB_file_t * stream )
{
    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    stream->buffer[stream->bufidx++] = ( char )c;

    if ( ( stream->bufidx == stream->bufsize )                   /* _IOFBF */
           || ( ( stream->status & _IOLBF ) && ( ( char )c == '\n' ) ) /* _IOLBF */
           || ( stream->status & _IONBF )                        /* _IONBF */
       )
    {
        /* buffer filled, unbuffered stream, or end-of-line. */
        c = ( _PDCLIB_flushbuffer( stream ) == 0 ) ? c : EOF;
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return c;
}